

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Body.h
# Opt level: O2

void __thiscall
RigidBodyDynamics::Body::Separate(Body *this,SpatialTransform *transform,Body *other_body)

{
  bool bVar1;
  RBDLError *this_00;
  long lVar2;
  PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *pPVar3;
  Matrix3d *pMVar4;
  byte bVar5;
  double dVar6;
  double dVar7;
  string local_350;
  Vector3d new_com;
  Vector3d other_com;
  PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *local_300;
  Matrix3d *local_2f8;
  double local_2e8;
  Body *local_2e0;
  DenseBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false>_> *local_2d0;
  Matrix3d new_inertia;
  Body local_278 [2];
  Body *local_158;
  double local_150;
  Body *local_148;
  double dStack_140;
  undefined8 uStack_138;
  double local_130;
  double local_128;
  double dStack_120;
  undefined8 local_118;
  Matrix3d inertia_substracted;
  Matrix3d inertia_other_com_rotated_this_origin;
  SpatialRigidBodyInertia this_rbi;
  
  bVar5 = 0;
  dVar7 = other_body->mMass;
  if ((dVar7 == 0.0) && (!NAN(dVar7))) {
    local_278[0].mCenterOfMass.super_Vector3d.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] = 0.0;
    bVar1 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator==
                      ((MatrixBase<Eigen::Matrix<double,3,3,0,3,3>> *)&other_body->mInertia,
                       (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                        *)local_278);
    if (bVar1) {
      return;
    }
    dVar7 = other_body->mMass;
  }
  dVar6 = this->mMass - dVar7;
  if ((dVar6 == 0.0) && (!NAN(dVar6))) {
    this_00 = (RBDLError *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_350,"Error: cannot separate bodies as both have zero mass!\n",
               (allocator<char> *)local_278);
    Errors::RBDLError::RBDLError(this_00,&local_350);
    __cxa_throw(this_00,&Errors::RBDLError::typeinfo,Errors::RBDLError::~RBDLError);
  }
  local_278[0].mCenterOfMass.super_Vector3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (double)&other_body->mCenterOfMass;
  local_278[0].mCenterOfMass.super_Vector3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       (double)&transform->r;
  local_278[0].mMass = (Scalar)transform;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Matrix<double,3,1,0,3,1>,0>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&other_com,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)local_278);
  local_278[0].mCenterOfMass.super_Vector3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       1.0 / dVar6;
  local_278[0].mInertia.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
  m_storage.m_data.array[2] = this->mMass;
  local_278[0].mInertia.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
  m_storage.m_data.array[3] = (double)&this->mCenterOfMass;
  local_278[0].mInertia.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
  m_storage.m_data.array[7] = dVar7;
  local_278[0].mInertia.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
  m_storage.m_data.array[8] = (double)&other_com;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&new_com,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>
              *)local_278);
  Math::SpatialRigidBodyInertia::createFromMassComInertiaC
            (&this_rbi,this->mMass,&this->mCenterOfMass,&this->mInertia);
  TransformInertiaToBodyFrame(&inertia_other_com_rotated_this_origin,transform,other_body);
  Math::SpatialRigidBodyInertia::toMatrix((SpatialMatrix *)local_278,&this_rbi);
  dStack_140 = 0.0;
  uStack_138 = 0;
  local_130 = 2.96439387504748e-323;
  local_158 = local_278;
  local_148 = local_278;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
  _set_noalias<Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,3,3,false>>
            ((PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)&new_inertia,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false>_> *)
             &local_158);
  local_300 = (PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)&new_inertia;
  local_2f8 = &inertia_other_com_rotated_this_origin;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,3,0,3,3>const,Eigen::Matrix<double,3,3,0,3,3>const>>
            ((PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)&inertia_substracted,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              *)&local_300);
  local_278[0].mMass = 0.0;
  local_278[0].mInertia.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
  m_storage.m_data.array[0] = 0.0;
  local_278[0].mInertia.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
  m_storage.m_data.array[3] =
       -new_com.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
        m_storage.m_data.array[0];
  local_278[0].mCenterOfMass.super_Vector3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       -new_com.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
        m_storage.m_data.array[1];
  local_278[0].mCenterOfMass.super_Vector3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       -new_com.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
        m_storage.m_data.array[2];
  local_278[0].mInertia.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
  m_storage.m_data.array[2] =
       new_com.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
       .m_data.array[1];
  local_278[0].mCenterOfMass.super_Vector3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       new_com.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
       .m_data.array[2];
  local_278[0].mInertia.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
  m_storage.m_data.array[1] =
       new_com.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
       .m_data.array[0];
  local_278[0].mInertia.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
  m_storage.m_data.array[4] = 0.0;
  local_158 = (Body *)0x0;
  local_128 = new_com.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
              m_storage.m_data.array[1];
  local_150 = new_com.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
              m_storage.m_data.array[2];
  uStack_138 = 0;
  local_130 = new_com.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
              m_storage.m_data.array[0];
  local_118 = 0;
  local_300 = (PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)&inertia_substracted;
  local_2e8 = dVar6;
  local_2e0 = local_278;
  local_2d0 = (DenseBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false>_> *)
              &local_158;
  local_148 = (Body *)local_278[0].mCenterOfMass.super_Vector3d.
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                      array[1];
  dStack_140 = local_278[0].mCenterOfMass.super_Vector3d.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
               [2];
  dStack_120 = local_278[0].mInertia.super_Matrix3d.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
               [3];
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,3,0,3,3>const,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,0>const>>
            ((PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)&new_inertia,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_0>_>_>
              *)&local_300);
  local_278[0].mMass = dVar6;
  local_278[0].mCenterOfMass.super_Vector3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       new_com.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
       .m_data.array[0];
  local_278[0].mCenterOfMass.super_Vector3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       new_com.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
       .m_data.array[1];
  local_278[0].mCenterOfMass.super_Vector3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       new_com.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
       .m_data.array[2];
  pPVar3 = (PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)&new_inertia;
  pMVar4 = &local_278[0].mInertia;
  for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
    (pMVar4->super_Matrix3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
    m_data.array[0] = *(double *)pPVar3;
    pPVar3 = pPVar3 + (ulong)bVar5 * -0x10 + 8;
    pMVar4 = (Matrix3d *)((long)pMVar4 + ((ulong)bVar5 * -2 + 1) * 8);
  }
  local_278[0].mIsVirtual = false;
  operator=(this,local_278);
  return;
}

Assistant:

void Separate(const Math::SpatialTransform &transform, const Body &other_body)
  {
#ifndef RBDL_USE_CASADI_MATH
    // nothing to do if we join a massles body to the current.
    if (other_body.mMass == 0. && other_body.mInertia == Math::Matrix3d::Zero())
    {
      return;
    }
#endif

    Math::Scalar other_mass = other_body.mMass;
    Math::Scalar new_mass = mMass - other_mass;

#ifndef RBDL_USE_CASADI_MATH
    if (new_mass == 0.)
    {
      throw Errors::RBDLError("Error: cannot separate bodies as both have zero mass!\n");
    }
#endif

    Math::Vector3d other_com =
        transform.E.transpose() * other_body.mCenterOfMass + transform.r;
    Math::Vector3d new_com = (1 / new_mass) * (mMass * mCenterOfMass - other_mass * other_com);

    LOG << "other_com = " << std::endl << other_com.transpose() << std::endl;
    LOG << "rotation = " << std::endl << transform.E << std::endl;

    // We have to transform the inertia of other_body to current COM (before separation).
    // This is done in 4 steps:
    // 1. Transform the inertia from other origin to other COM
    // 2. Rotate the inertia that it is aligned to the frame of this body
    // 3. Transform inertia of other_body to the origin of the frame of
    // this body
    // 4. Substract the two inertias
    // 5. Transform the new inertia to the new COM

    Math::SpatialRigidBodyInertia this_rbi =
        Math::SpatialRigidBodyInertia::createFromMassComInertiaC(mMass, mCenterOfMass, mInertia);

    Math::Matrix3d inertia_other_com_rotated_this_origin =
        TransformInertiaToBodyFrame(transform, other_body);

    // 4. Substract the two inertias
    Math::Matrix3d inertia_substracted = Math::Matrix3d(this_rbi.toMatrix().block<3, 3>(0, 0)) -
                                         inertia_other_com_rotated_this_origin;
    LOG << "inertia_substracted  = " << std::endl << inertia_substracted << std::endl;

    // 5. Transform the summed inertia to the new COM
    Math::Matrix3d new_inertia =
        inertia_substracted - new_mass * Math::VectorCrossMatrix(new_com) *
                                  Math::VectorCrossMatrix(new_com).transpose();

    *this = Body (new_mass, new_com, new_inertia);
  }